

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_posix_file_impl.h
# Opt level: O0

exr_result_t default_init_write_file(exr_context_t file)

{
  code *pcVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  long in_RDI;
  char *outfn;
  _internal_exr_filehandle *fh;
  int fd;
  char *local_28;
  exr_result_t local_4;
  
  piVar3 = *(int **)(in_RDI + 0x88);
  local_28 = *(char **)(in_RDI + 0x20);
  if (local_28 == (char *)0x0) {
    local_28 = *(char **)(in_RDI + 0x10);
  }
  *piVar3 = -1;
  *(code **)(in_RDI + 0x90) = default_shutdown;
  *(code **)(in_RDI + 0xa8) = default_write_func;
  iVar2 = open(local_28,0x80241,0x1b6);
  if (iVar2 < 0) {
    pcVar1 = *(code **)(in_RDI + 0x48);
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    local_4 = (*pcVar1)(in_RDI,5,"Unable to open file for write: %s",pcVar4);
  }
  else {
    *piVar3 = iVar2;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static exr_result_t
default_init_write_file (exr_context_t file)
{
    int                              fd;
    struct _internal_exr_filehandle* fh    = file->user_data;
    const char*                      outfn = file->tmp_filename.str;
    if (outfn == NULL) outfn = file->filename.str;

#if !CAN_USE_PREAD
#    ifdef ILMTHREAD_THREADING_ENABLED
    fd = pthread_mutex_init (&(fh->mutex), NULL);
    if (fd != 0)
        return file->print_error (
            file,
            EXR_ERR_OUT_OF_MEMORY,
            "Unable to initialize file mutex: %s",
            strerror (fd));
#    endif
#endif

    fh->fd           = -1;
    file->destroy_fn = &default_shutdown;
    file->write_fn   = &default_write_func;

    fd = open (
        outfn,
        O_WRONLY | O_CREAT | O_TRUNC | O_CLOEXEC,
        S_IRUSR | S_IWUSR | S_IRGRP | S_IWGRP | S_IROTH | S_IWOTH);
    if (fd < 0)
        return file->print_error (
            file,
            EXR_ERR_FILE_ACCESS,
            "Unable to open file for write: %s",
            strerror (errno));
    fh->fd = fd;

    return EXR_ERR_SUCCESS;
}